

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImFontConfig::ImFontConfig(ImFontConfig *this)

{
  memset(this,0,0x90);
  this->FontDataOwnedByAtlas = true;
  this->OversampleH = 2;
  this->OversampleV = 1;
  this->GlyphMaxAdvanceX = 3.4028235e+38;
  this->RasterizerMultiply = 1.0;
  this->RasterizerDensity = 1.0;
  this->EllipsisChar = 0xffff;
  return;
}

Assistant:

ImFontConfig::ImFontConfig()
{
    memset(this, 0, sizeof(*this));
    FontDataOwnedByAtlas = true;
    OversampleH = 2;
    OversampleV = 1;
    GlyphMaxAdvanceX = FLT_MAX;
    RasterizerMultiply = 1.0f;
    RasterizerDensity = 1.0f;
    EllipsisChar = (ImWchar)-1;
}